

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall MPLSStreamInfo::parseStreamAttributes(MPLSStreamInfo *this,BitStreamReader *reader)

{
  bool bVar1;
  uchar uVar2;
  StreamType SVar3;
  BitStreamReader *reader_local;
  MPLSStreamInfo *this_local;
  
  BitStreamReader::skipBits(reader,8);
  SVar3 = BitStreamReader::getBits(reader,8);
  (this->super_M2TSStreamInfo).stream_coding_type = SVar3;
  bVar1 = isVideoStreamType((this->super_M2TSStreamInfo).stream_coding_type);
  if (bVar1) {
    uVar2 = BitStreamReader::getBits<unsigned_char>(reader,4);
    (this->super_M2TSStreamInfo).video_format = uVar2;
    uVar2 = BitStreamReader::getBits<unsigned_char>(reader,4);
    (this->super_M2TSStreamInfo).frame_rate_index = uVar2;
    BitStreamReader::skipBits(reader,0x18);
  }
  else {
    bVar1 = isAudioStreamType((this->super_M2TSStreamInfo).stream_coding_type);
    if (bVar1) {
      uVar2 = BitStreamReader::getBits<unsigned_char>(reader,4);
      (this->super_M2TSStreamInfo).audio_presentation_type = uVar2;
      BitStreamReader::skipBits(reader,4);
      CLPIStreamInfo::readString((this->super_M2TSStreamInfo).language_code,reader,3);
    }
    else if (((this->super_M2TSStreamInfo).stream_coding_type == SUB_PGS) ||
            ((this->super_M2TSStreamInfo).stream_coding_type == SUB_IGS)) {
      CLPIStreamInfo::readString((this->super_M2TSStreamInfo).language_code,reader,3);
      BitStreamReader::skipBits(reader,8);
    }
    else if ((this->super_M2TSStreamInfo).stream_coding_type == SUB_TGS) {
      uVar2 = BitStreamReader::getBits<unsigned_char>(reader,8);
      (this->super_M2TSStreamInfo).character_code = uVar2;
      CLPIStreamInfo::readString((this->super_M2TSStreamInfo).language_code,reader,3);
    }
  }
  return;
}

Assistant:

void MPLSStreamInfo::parseStreamAttributes(BitStreamReader& reader)
{
    reader.skipBits(8);  // length
    stream_coding_type = static_cast<StreamType>(reader.getBits(8));
    if (isVideoStreamType(stream_coding_type))
    {
        video_format = reader.getBits<uint8_t>(4);
        frame_rate_index = reader.getBits<uint8_t>(4);
        reader.skipBits(24);  // reserved_for_future_use
    }
    else if (isAudioStreamType(stream_coding_type))
    {
        audio_presentation_type = reader.getBits<uint8_t>(4);
        reader.skipBits(4);  // sampling_frequency_index
        CLPIStreamInfo::readString(language_code, reader, 3);
    }
    else if (stream_coding_type == StreamType::SUB_PGS || stream_coding_type == StreamType::SUB_IGS)
    {
        CLPIStreamInfo::readString(language_code, reader, 3);
        reader.skipBits(8);  // reserved_for_future_use
    }
    else if (stream_coding_type == StreamType::SUB_TGS)
    {
        // Text subtitle stream
        character_code = reader.getBits<uint8_t>(8);
        CLPIStreamInfo::readString(language_code, reader, 3);
    }
}